

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceCacheGL::CachedResourceView::Set
          (CachedResourceView *this,RefCntAutoPtr<Diligent::TextureViewGLImpl> *pTexView,
          bool SetSampler)

{
  TextureViewGLImpl *pTVar1;
  TextureBaseGL *pTVar2;
  SamplerGLImpl *pSVar3;
  long lVar4;
  
  if (pTexView->m_pObject == (TextureViewGLImpl *)0x0) {
    lVar4 = 8;
    pSVar3 = (SamplerGLImpl *)0x0;
  }
  else {
    pTVar2 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture<Diligent::TextureBaseGL>
                       (&pTexView->m_pObject->super_TextureViewBase<Diligent::EngineGLImplTraits>);
    pTVar1 = pTexView->m_pObject;
    this->pTexture = pTVar2;
    if (!SetSampler || pTVar1 == (TextureViewGLImpl *)0x0) goto LAB_0016a8ba;
    pSVar3 = RefCntAutoPtr<Diligent::ISampler>::RawPtr<Diligent::SamplerGLImpl>
                       (&(pTVar1->super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pSampler);
    lVar4 = 0x10;
  }
  *(SamplerGLImpl **)((long)&(this->pView).m_pObject + lVar4) = pSVar3;
LAB_0016a8ba:
  RefCntAutoPtr<Diligent::IDeviceObject>::operator=(&this->pView,pTexView);
  return;
}

Assistant:

void Set(RefCntAutoPtr<TextureViewGLImpl>&& pTexView, bool SetSampler)
        {
            // Do not null out pSampler as it could've been initialized by PipelineResourceSignatureGLImpl::InitSRBResourceCache!
            // pSampler = nullptr;

            // Avoid unnecessary virtual call
            pTexture = pTexView ? pTexView->GetTexture<TextureBaseGL>() : nullptr;
            if (pTexView && SetSampler)
            {
                pSampler = pTexView->GetSampler<SamplerGLImpl>();
            }

            pView = std::move(pTexView);
        }